

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlbackend.h
# Opt level: O1

void __thiscall
rengine::SDLBackend::sendPointerEvent(SDLBackend *this,SDL_Event *sdlEvent,Type type)

{
  int iVar1;
  Uint32 UVar2;
  float fVar3;
  undefined **local_78;
  PointerEvent pe;
  int local_30;
  undefined1 local_2c [4];
  int dw;
  int dh;
  int ww;
  int wh;
  
  if (this->m_window == (SDL_Window *)0x0) {
    __assert_fail("m_window",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/sdl/sdlbackend.h"
                  ,0x98,"void rengine::SDLBackend::sendPointerEvent(SDL_Event *, Event::Type)");
  }
  UVar2 = SDL_GetWindowID();
  if (UVar2 != (sdlEvent->display).display) {
    __assert_fail("SDL_GetWindowID(m_window) == sdlEvent->button.windowID",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/sdl/sdlbackend.h"
                  ,0x99,"void rengine::SDLBackend::sendPointerEvent(SDL_Event *, Event::Type)");
  }
  if (this->m_surface == (Surface *)0x0) {
    __assert_fail("m_surface",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/backend/sdl/sdlbackend.h"
                  ,0x9a,"void rengine::SDLBackend::sendPointerEvent(SDL_Event *, Event::Type)");
  }
  local_78 = &PTR__Event_001348a8;
  pe.super_Event._4_8_ = 0;
  pe.super_Event._12_4_ = 0;
  pe._16_4_ = 0;
  pe.super_Event._vptr_Event._0_4_ = type;
  if (type - PointerDown < 3) {
    iVar1 = (sdlEvent->window).data2;
    unique0x10000090 = ZEXT416((uint)(float)(sdlEvent->motion).y);
    SDL_GetWindowSize(this->m_window,&dw,&dh);
    SDL_GL_GetDrawableSize(this->m_window,&local_30,local_2c);
    fVar3 = (float)((long)local_30 / (long)dw & 0xffffffff);
    pe.super_Event._vptr_Event._4_4_ = (float)iVar1 * fVar3;
    pe.super_Event.m_type = (Type)(pe.m_posInSurface.y * fVar3);
    pe._16_4_ = pe.super_Event.m_type;
    pe.super_Event._12_4_ = pe.super_Event._vptr_Event._4_4_;
    (*this->m_surface->_vptr_Surface[3])
              (this->m_surface,&local_78,(long)local_30 % (long)dw & 0xffffffff);
    return;
  }
  __assert_fail("t == PointerUp || t == PointerDown || t == PointerMove",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/windowsystem/event.h"
                ,0x37,"rengine::PointerEvent::PointerEvent(Type)");
}

Assistant:

inline void SDLBackend::sendPointerEvent(SDL_Event *sdlEvent, Event::Type type)
{
    assert(m_window);
    assert(SDL_GetWindowID(m_window) == sdlEvent->button.windowID);
    assert(m_surface);

    PointerEvent pe(type);
    pe.initialize(vec2(sdlEvent->button.x, sdlEvent->button.y) * devicePixelRatio());
    m_surface->onEvent(&pe);
}